

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Explosion.cpp
# Opt level: O0

void __thiscall Explosion::Explosion(Explosion *this,float x,float y,bool big)

{
  int iVar1;
  byte in_SIL;
  Entity *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  
  Entity::Entity(in_RDI);
  in_RDI->_vptr_Entity = (_func_int **)&PTR_logic_0011e680;
  in_RDI->x = in_XMM0_Da;
  in_RDI->y = in_XMM1_Da;
  in_RDI->dx = 0.0;
  in_RDI->dy = 0.0;
  iVar1 = 0xc;
  if ((in_SIL & 1) != 0) {
    iVar1 = 0x20;
  }
  in_RDI->radius = (float)iVar1;
  in_RDI->isDestructable = false;
  in_RDI->hp = 1;
  *(undefined4 *)&in_RDI->field_0x34 = 100;
  *(undefined4 *)&in_RDI[1]._vptr_Entity = 0;
  *(byte *)((long)&in_RDI[1]._vptr_Entity + 4) = in_SIL & 1;
  return;
}

Assistant:

Explosion::Explosion(float x, float y, bool big)
{
   this->x = x;
   this->y = y;
   dx = 0.0f;
   dy = 0.0f;
   radius = (big) ? 32 : 12;
   isDestructable = false;
   hp = 1;

   frameCount = FRAME_TIME;
   currFrame = 0;
   this->big = big;
}